

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_basic_types.cpp
# Opt level: O2

bool __thiscall Potassco::BufferedStream::match(BufferedStream *this,char *w)

{
  BufferType pcVar1;
  int iVar2;
  size_t __n;
  size_t sVar3;
  ulong __n_00;
  
  __n = strlen(w);
  sVar3 = this->rpos_;
  __n_00 = 0x1000 - sVar3;
  if (__n_00 < __n) {
    if (0x1000 < __n) {
      Potassco::fail(-1,"bool Potassco::BufferedStream::match(const char *)",0x66,"wLen <= BUF_SIZE"
                     ,"Token too long - Increase BUF_SIZE!",0);
    }
    memcpy(this->buf_,this->buf_ + sVar3,__n_00);
    this->rpos_ = __n_00;
    sVar3 = 0;
    underflow(this,false);
    this->rpos_ = 0;
  }
  pcVar1 = this->buf_;
  iVar2 = strncmp(w,pcVar1 + sVar3,__n);
  if ((iVar2 == 0) && (this->rpos_ = sVar3 + __n, pcVar1[sVar3 + __n] == '\0')) {
    underflow(this,true);
  }
  return iVar2 == 0;
}

Assistant:

bool BufferedStream::match(const char* w) {
	std::size_t wLen = std::strlen(w);
	std::size_t bLen = BUF_SIZE - rpos_;
	if (bLen < wLen) {
		POTASSCO_ASSERT(wLen <= BUF_SIZE, "Token too long - Increase BUF_SIZE!");
		std::memcpy(buf_, buf_ + rpos_, bLen);
		rpos_ = bLen;
		underflow(false);
		rpos_ = 0;
	}
	if (std::strncmp(w, buf_ + rpos_, wLen) == 0) {
		if (!buf_[rpos_ += wLen]) { underflow(); }
		return true;
	}
	return false;
}